

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::integerCheck(TParseContext *this,TIntermTyped *node,char *token)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  TBasicType from;
  int iVar2;
  undefined4 extraout_var;
  
  from = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
  if ((from & ~EbtFloat) != EbtInt) {
    bVar1 = TIntermediate::canImplicitlyPromote
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,from,EbtInt
                       ,EOpNull);
    if (!bVar1) {
      bVar1 = TIntermediate::canImplicitlyPromote
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate,from,
                         EbtUint,EOpNull);
      if (!bVar1) goto LAB_004b1d3d;
    }
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2c])(node);
  if ((char)iVar2 != '\0') {
    return;
  }
LAB_004b1d3d:
  iVar2 = (**(node->super_TIntermNode)._vptr_TIntermNode)(node);
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)
            (this,CONCAT44(extraout_var,iVar2),"scalar integer expression required",token,"",
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::integerCheck(const TIntermTyped* node, const char* token)
{
    auto from_type = node->getBasicType();
    if ((from_type == EbtInt || from_type == EbtUint ||
         intermediate.canImplicitlyPromote(from_type, EbtInt, EOpNull) ||
         intermediate.canImplicitlyPromote(from_type, EbtUint, EOpNull)) && node->isScalar())
        return;

    error(node->getLoc(), "scalar integer expression required", token, "");
}